

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add127_test.cc
# Opt level: O0

void intgemm::anon_unknown_0::TestMultiplyShiftNonShift<intgemm::SSSE3::Kernels8>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  anon_class_8_1_8989cfb7 callback;
  UnquantizeAndAddBiasAndWrite callback_00;
  UnquantizeAndAddBiasAndWrite callback_01;
  UnquantizeAndAddBiasAndWrite callback_02;
  ostream *poVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *output_addr;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  result_type_conflict rVar6;
  Index width_00;
  float fVar7;
  float unquant_mult_forprep;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<float> test_C;
  AlignedVector<signed_char> B_prep;
  AlignedVector<signed_char> A_prep_old;
  AlignedVector<unsigned_char> A_prep;
  float unquant_mult;
  float quant_mult;
  float alpha;
  float *it_2;
  float *__end2_2;
  float *__begin2_2;
  AlignedVector<float> *__range2_2;
  float *it_1;
  float *__end2_1;
  float *__begin2_1;
  AlignedVector<float> *__range2_1;
  float *it;
  float *__end2;
  float *__begin2;
  AlignedVector<float> *__range2;
  uniform_real_distribution<float> dist;
  mt19937 gen;
  AlignedVector<float> bias;
  AlignedVector<float> B;
  AlignedVector<float> A;
  ostringstream info;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe828;
  Index cols;
  uniform_real_distribution<float> *in_stack_ffffffffffffe830;
  uint8_t *in_stack_ffffffffffffe838;
  AlignedVector<float> *in_stack_ffffffffffffe840;
  undefined8 in_stack_ffffffffffffe858;
  Index B_cols_00;
  undefined8 in_stack_ffffffffffffe860;
  float *in_stack_ffffffffffffe868;
  float *in_stack_ffffffffffffe870;
  undefined4 in_stack_ffffffffffffe878;
  undefined4 in_stack_ffffffffffffe87c;
  undefined4 in_stack_ffffffffffffe880;
  undefined4 in_stack_ffffffffffffe884;
  float unquant_mult_00;
  string local_16b0 [32];
  UnquantizeAndAddBiasAndWrite local_1690;
  UnquantizeAndAddBiasAndWrite local_1678;
  float local_165c;
  AlignedVector<float> *local_1658;
  AlignedVector<float> local_1650;
  UnquantizeAndAddBiasAndWrite local_1640;
  AlignedVector<float> local_1628;
  AlignedVector<float> local_1618;
  AlignedVector<signed_char> local_1608;
  AlignedVector<signed_char> local_15f8;
  Index in_stack_ffffffffffffea18;
  Index in_stack_ffffffffffffea1c;
  int8_t *in_stack_ffffffffffffea20;
  float A_rows_00;
  undefined4 in_stack_ffffffffffffea38;
  Index in_stack_ffffffffffffea3c;
  Index width_01;
  Index A_rows_01;
  AlignedVector<float> *this;
  float *in_stack_ffffffffffffea58;
  AlignedVector<float> *this_00;
  float *local_1578;
  float in_stack_fffffffffffff010;
  float in_stack_fffffffffffff014;
  float in_stack_fffffffffffff018;
  float in_stack_fffffffffffff01c;
  string *in_stack_fffffffffffff020;
  size_t in_stack_fffffffffffff028;
  float *in_stack_fffffffffffff030;
  float *in_stack_fffffffffffff038;
  float *in_stack_fffffffffffff040;
  AlignedVector<float> local_1d8;
  AlignedVector<float> local_1c8;
  AlignedVector<float> local_1b8 [2];
  ostringstream local_198 [396];
  uint local_c;
  uint local_8;
  uint local_4;
  
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"8-bit SSSE3");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  std::operator<<(poVar1,'\n');
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
             (size_t)in_stack_ffffffffffffe830);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
             (size_t)in_stack_ffffffffffffe830);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
             (size_t)in_stack_ffffffffffffe830);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x1e6bbf);
  std::uniform_real_distribution<float>::uniform_real_distribution
            (in_stack_ffffffffffffe830,(float)((ulong)in_stack_ffffffffffffe828 >> 0x20),
             SUB84(in_stack_ffffffffffffe828,0));
  local_1578 = AlignedVector<float>::begin(local_1b8);
  pfVar2 = AlignedVector<float>::end(local_1b8);
  for (; local_1578 != pfVar2; local_1578 = local_1578 + 1) {
    rVar6 = std::uniform_real_distribution<float>::operator()
                      (in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
    *local_1578 = rVar6;
  }
  this_00 = &local_1c8;
  pfVar2 = AlignedVector<float>::begin(this_00);
  pfVar3 = AlignedVector<float>::end(this_00);
  while (B_cols_00 = (Index)((ulong)in_stack_ffffffffffffe858 >> 0x20), pfVar2 != pfVar3) {
    pfVar4 = pfVar2;
    rVar6 = std::uniform_real_distribution<float>::operator()
                      (in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
    *pfVar2 = rVar6;
    in_stack_ffffffffffffea58 = pfVar2;
    pfVar2 = pfVar4 + 1;
  }
  this = &local_1d8;
  pfVar4 = AlignedVector<float>::begin(this);
  cols = (Index)((ulong)in_stack_ffffffffffffe828 >> 0x20);
  pfVar5 = AlignedVector<float>::end(this);
  width_01 = (Index)pfVar5;
  A_rows_01 = (Index)((ulong)pfVar5 >> 0x20);
  for (; pfVar4 != pfVar5; pfVar4 = pfVar4 + 1) {
    in_stack_ffffffffffffea38 = SUB84(pfVar4,0);
    in_stack_ffffffffffffea3c = (Index)((ulong)pfVar4 >> 0x20);
    *pfVar4 = 0.0;
  }
  A_rows_00 = 2.0;
  width_00 = 0x427e0000;
  fVar7 = 0.0002480005;
  AlignedVector<float>::size(local_1b8);
  AlignedVector<unsigned_char>::AlignedVector
            ((AlignedVector<unsigned_char> *)in_stack_ffffffffffffe840,
             (size_t)in_stack_ffffffffffffe838,(size_t)in_stack_ffffffffffffe830);
  AlignedVector<float>::size(local_1b8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe840,
             (size_t)in_stack_ffffffffffffe838,(size_t)in_stack_ffffffffffffe830);
  AlignedVector<float>::size(&local_1c8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe840,
             (size_t)in_stack_ffffffffffffe838,(size_t)in_stack_ffffffffffffe830);
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<unsigned_char>::begin((AlignedVector<unsigned_char> *)&stack0xffffffffffffea18);
  SSSE3::Kernels8::PrepareA
            ((float *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe838,
             (float)((ulong)in_stack_ffffffffffffe830 >> 0x20),(Index)in_stack_ffffffffffffe830,cols
            );
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<signed_char>::begin(&local_15f8);
  SSSE3::Kernels8::PrepareA
            ((float *)in_stack_ffffffffffffe840,(int8_t *)in_stack_ffffffffffffe838,
             (float)((ulong)in_stack_ffffffffffffe830 >> 0x20),(Index)in_stack_ffffffffffffe830,cols
            );
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<signed_char>::begin(&local_1608);
  SSSE3::Kernels8::PrepareB
            ((float *)CONCAT44(in_stack_ffffffffffffe884,in_stack_ffffffffffffe880),
             (int8_t *)CONCAT44(in_stack_ffffffffffffe87c,in_stack_ffffffffffffe878),
             (float)((ulong)in_stack_ffffffffffffe870 >> 0x20),(Index)in_stack_ffffffffffffe870,
             (Index)((ulong)in_stack_ffffffffffffe868 >> 0x20));
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
             (size_t)in_stack_ffffffffffffe830);
  AlignedVector<float>::size(&local_1618);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
             (size_t)in_stack_ffffffffffffe830);
  AlignedVector<signed_char>::begin(&local_15f8);
  AlignedVector<signed_char>::begin(&local_1608);
  unquant_mult_00 = fVar7;
  pfVar5 = AlignedVector<float>::begin(&local_1d8);
  output_addr = AlignedVector<float>::begin(&local_1628);
  callbacks::UnquantizeAndAddBiasAndWrite::UnquantizeAndAddBiasAndWrite
            (&local_1640,fVar7,pfVar5,output_addr);
  callback_02.bias_addr = pfVar2;
  callback_02._0_8_ = pfVar3;
  callback_02.output_addr = (float *)this_00;
  SSSE3::Kernels8::Multiply<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            ((int8_t *)this,(int8_t *)pfVar4,A_rows_01,width_01,in_stack_ffffffffffffea3c,
             callback_02);
  AlignedVector<float>::size(&local_1618);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe840,(size_t)local_1640.output_addr,(size_t)local_1640.bias_addr);
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<float>::begin(&local_1650);
  local_1658 = &local_1d8;
  callback.bias._4_4_ = in_stack_ffffffffffffe884;
  callback.bias._0_4_ = in_stack_ffffffffffffe880;
  references::
  Multiply<float,_float,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_add127_test_cc:188:86),_nullptr>
            ((float *)CONCAT44(in_stack_ffffffffffffe87c,in_stack_ffffffffffffe878),
             in_stack_ffffffffffffe870,in_stack_ffffffffffffe868,
             (Index)((ulong)in_stack_ffffffffffffe860 >> 0x20),(Index)in_stack_ffffffffffffe860,
             B_cols_00,callback);
  local_165c = (-A_rows_00 * A_rows_00) / 127.0;
  AlignedVector<signed_char>::begin(&local_1608);
  fVar7 = local_165c;
  pfVar2 = AlignedVector<float>::begin(&local_1d8);
  pfVar4 = AlignedVector<float>::begin(&local_1d8);
  callbacks::UnquantizeAndAddBiasAndWrite::UnquantizeAndAddBiasAndWrite
            (&local_1678,fVar7,pfVar2,pfVar4);
  callback_00._4_4_ = A_rows_00;
  callback_00.unquant_mult = (float)width_00;
  callback_00.bias_addr._0_4_ = in_stack_ffffffffffffea38;
  callback_00.bias_addr._4_4_ = in_stack_ffffffffffffea3c;
  callback_00.output_addr._0_4_ = width_01;
  callback_00.output_addr._4_4_ = A_rows_01;
  SSSE3::Kernels8::PrepareBias<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (in_stack_ffffffffffffea20,in_stack_ffffffffffffea1c,in_stack_ffffffffffffea18,
             callback_00);
  AlignedVector<unsigned_char>::begin((AlignedVector<unsigned_char> *)&stack0xffffffffffffea18);
  AlignedVector<signed_char>::begin(&local_1608);
  fVar7 = unquant_mult_00;
  pfVar2 = AlignedVector<float>::begin(&local_1d8);
  pfVar4 = AlignedVector<float>::begin(&local_1618);
  callbacks::UnquantizeAndAddBiasAndWrite::UnquantizeAndAddBiasAndWrite
            (&local_1690,unquant_mult_00,pfVar2,pfVar4);
  callback_01.bias_addr = in_stack_ffffffffffffea58;
  callback_01._0_8_ = this;
  callback_01.output_addr = pfVar3;
  SSSE3::Kernels8::Multiply8Shift<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            ((uint8_t *)CONCAT44(A_rows_01,width_01),
             (int8_t *)CONCAT44(in_stack_ffffffffffffea3c,in_stack_ffffffffffffea38),
             (Index)A_rows_00,width_00,(Index)fVar7,callback_01);
  AlignedVector<float>::begin(&local_1650);
  AlignedVector<float>::begin(&local_1628);
  AlignedVector<float>::begin(&local_1618);
  AlignedVector<float>::size(&local_1618);
  std::__cxx11::ostringstream::str();
  CompareMSE(in_stack_fffffffffffff040,in_stack_fffffffffffff038,in_stack_fffffffffffff030,
             in_stack_fffffffffffff028,in_stack_fffffffffffff020,in_stack_fffffffffffff01c,
             in_stack_fffffffffffff018,in_stack_fffffffffffff014,in_stack_fffffffffffff010);
  std::__cxx11::string::~string(local_16b0);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e73ff);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e740c);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e7419);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1e7426);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1e7433);
  AlignedVector<unsigned_char>::~AlignedVector((AlignedVector<unsigned_char> *)0x1e7440);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e744d);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e745a);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e7467);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void TestMultiplyShiftNonShift(Index A_rows, Index width, Index B_cols,
 float int_tolerance=.1, float float_tolerance=1, float MSE_float_tolerance=0, float MSE_int_tolerance=0) {
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = 0;
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<uint8_t> A_prep(A.size());
  AlignedVector<int8_t> A_prep_old(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareA(A.begin(), A_prep_old.begin(), quant_mult, A_rows, width); //Non shited version
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  /*
   * Reference non shift multiplication instead of slowint
   */
  AlignedVector<float> slowint_C(test_C.size());
  Routine::Multiply(A_prep_old.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), slowint_C.begin()));

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return static_cast<float>(sum) + bias[info.col_idx];
  });

  /*
   * Multiply8 shift multiplication
   */
  float unquant_mult_forprep = (-1.0f)*(alpha)*(alpha)/(127.0f); //Minus one to invert add_ps later on
  Routine::PrepareBias(B_prep.begin(), width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult_forprep, bias.begin(), bias.begin()));
  Routine::Multiply8Shift(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}